

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# realdata_unit.c
# Opt level: O1

_Bool compare_negations(roaring_bitmap_t **rnorun,roaring_bitmap_t **rruns,size_t count)

{
  long lVar1;
  _Bool _Var2;
  char *__s;
  ulong uVar3;
  _Bool _Var4;
  
  _Var4 = count == 0;
  if (!_Var4) {
    uVar3 = 1;
    do {
      _Var2 = is_negation_correct(rnorun[uVar3 - 1]);
      if (!_Var2) {
        __s = "no-run negation incorrect";
LAB_00103acb:
        puts(__s);
        return _Var4;
      }
      _Var2 = is_negation_correct(rruns[uVar3 - 1]);
      if (!_Var2) {
        __s = "runs negations incorrect";
        goto LAB_00103acb;
      }
      _Var4 = count <= uVar3;
      lVar1 = uVar3 + 1;
      uVar3 = uVar3 + 1;
    } while (lVar1 - count != 1);
  }
  return _Var4;
}

Assistant:

bool compare_negations(roaring_bitmap_t **rnorun, roaring_bitmap_t **rruns,
                       size_t count) {
    for (size_t i = 0; i < count; ++i) {
        if (!is_negation_correct(rnorun[i])) {
            printf("no-run negation incorrect\n");
            return false;
        }
        if (!is_negation_correct(rruns[i])) {
            printf("runs negations incorrect\n");
            return false;
        }
    }
    return true;
}